

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

JavascriptEnumerator * __thiscall
Js::ES5Array::GetIndexEnumerator(ES5Array *this,EnumeratorFlags flags,ScriptContext *requestContext)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  ES5ArrayIndexEnumerator *this_01;
  TrackAllocData local_48;
  ScriptContext *local_20;
  ScriptContext *requestContext_local;
  ES5Array *pEStack_10;
  EnumeratorFlags flags_local;
  ES5Array *this_local;
  
  local_20 = requestContext;
  requestContext_local._7_1_ = flags;
  pEStack_10 = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&ES5ArrayIndexEnumerator::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ES5Array.cpp"
             ,0x138);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_01 = (ES5ArrayIndexEnumerator *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  ES5ArrayIndexEnumerator::ES5ArrayIndexEnumerator(this_01,this,requestContext_local._7_1_,local_20)
  ;
  return (JavascriptEnumerator *)this_01;
}

Assistant:

JavascriptEnumerator * ES5Array::GetIndexEnumerator(EnumeratorFlags flags, ScriptContext* requestContext)
    {
        // ES5Array does not support compat mode, ignore preferSnapshotSemantics
        return RecyclerNew(GetScriptContext()->GetRecycler(), ES5ArrayIndexEnumerator, this, flags, requestContext);
    }